

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O1

bool __thiscall cmCTestBZR::UpdateParser::ProcessLine(UpdateParser *this)

{
  char c0;
  char c1;
  char c2;
  char *pcVar1;
  bool bVar2;
  char *local_a8;
  undefined8 local_a0;
  char local_98;
  undefined7 uStack_97;
  string local_88;
  char *local_68;
  undefined8 local_60;
  char local_58;
  undefined7 uStack_57;
  char *local_48;
  undefined8 local_40;
  char local_38;
  undefined7 uStack_37;
  
  bVar2 = cmsys::RegularExpression::find
                    (&this->RegexUpdate,(this->super_LineParser).Line._M_dataplus._M_p);
  if (bVar2) {
    pcVar1 = (this->RegexUpdate).startp[1];
    local_a8 = &local_98;
    if (pcVar1 == (char *)0x0) {
      local_a0 = 0;
      local_98 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,pcVar1,(this->RegexUpdate).endp[1]);
    }
    c0 = *local_a8;
    pcVar1 = (this->RegexUpdate).startp[2];
    if (pcVar1 == (char *)0x0) {
      local_48 = &local_38;
      local_40 = 0;
      local_38 = '\0';
    }
    else {
      local_48 = &local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,pcVar1,(this->RegexUpdate).endp[2]);
    }
    c1 = *local_48;
    pcVar1 = (this->RegexUpdate).startp[3];
    if (pcVar1 == (char *)0x0) {
      local_68 = &local_58;
      local_60 = 0;
      local_58 = '\0';
    }
    else {
      local_68 = &local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,pcVar1,(this->RegexUpdate).endp[3]);
    }
    c2 = *local_68;
    pcVar1 = (this->RegexUpdate).startp[4];
    if (pcVar1 == (char *)0x0) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,pcVar1,(this->RegexUpdate).endp[4]);
    }
    DoPath(this,c0,c1,c2,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
    }
  }
  return true;
}

Assistant:

bool ProcessLine()
    {
    if(this->RegexUpdate.find(this->Line))
      {
      this->DoPath(this->RegexUpdate.match(1)[0],
                   this->RegexUpdate.match(2)[0],
                   this->RegexUpdate.match(3)[0],
                   this->RegexUpdate.match(4));
      }
    return true;
    }